

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrixUtil.hpp
# Opt level: O0

Matrix<double,_4,_2> * __thiscall
tcu::transpose<double,2,4>
          (Matrix<double,_4,_2> *__return_storage_ptr__,tcu *this,Matrix<double,_2,_4> *mat)

{
  double dVar1;
  double *pdVar2;
  undefined4 local_24;
  undefined4 local_20;
  int col;
  int row;
  Matrix<double,_2,_4> *mat_local;
  Matrix<double,_4,_2> *res;
  
  Matrix<double,_4,_2>::Matrix(__return_storage_ptr__);
  for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
    for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
      pdVar2 = Matrix<double,_2,_4>::operator()((Matrix<double,_2,_4> *)this,local_20,local_24);
      dVar1 = *pdVar2;
      pdVar2 = Matrix<double,_4,_2>::operator()(__return_storage_ptr__,local_24,local_20);
      *pdVar2 = dVar1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline Matrix<T, Cols, Rows> transpose (const Matrix<T, Rows, Cols>& mat)
{
	Matrix<T, Cols, Rows> res;
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			res(col, row) = mat(row, col);
	return res;
}